

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O2

ostream * despot::operator<<(ostream *os,LaserTag *lasertag)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  int i;
  ulong uVar6;
  long lVar7;
  
  lVar7 = 0;
  while( true ) {
    iVar2 = (**(code **)(*(long *)&lasertag->super_BaseTag + 0x10))(lasertag);
    if (iVar2 <= lVar7) break;
    poVar3 = std::operator<<(os,"State ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)lVar7);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar3,
                        (lasertag->super_BaseTag).opp_.super__Vector_base<int,_std::allocator<int>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar7]);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar3,
                        (lasertag->super_BaseTag).rob_.super__Vector_base<int,_std::allocator<int>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar7]);
    poVar3 = std::operator<<(poVar3," ");
    iVar2 = despot::Floor::NumCells();
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
    (**(code **)(*(long *)&lasertag->super_BaseTag + 0xc0))
              (lasertag,(lasertag->super_BaseTag).states_.
                        super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar7],os);
    for (lVar5 = 0; lVar5 < LaserTag::NBEAMS; lVar5 = lVar5 + 1) {
      std::ostream::operator<<((ostream *)os,(int)lVar5);
      lVar4 = lVar5 * 0x18;
      for (uVar6 = 0;
          lVar1 = *(long *)&(lasertag->reading_distributions_).
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar7].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data,
          uVar6 < (ulong)(*(long *)(lVar1 + 8 + lVar4) - *(long *)(lVar1 + lVar4) >> 3);
          uVar6 = uVar6 + 1) {
        std::operator<<(os," ");
        std::ostream::_M_insert<double>
                  (*(double *)
                    (*(long *)(*(long *)&(lasertag->reading_distributions_).
                                         super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar7].
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data + lVar4) + uVar6 * 8));
      }
      std::endl<char,std::char_traits<char>>(os);
    }
    lVar7 = lVar7 + 1;
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const LaserTag& lasertag) {
	for (int s = 0; s < lasertag.NumStates(); s++) {
		os << "State " << s << " " << lasertag.opp_[s] << " "
			<< lasertag.rob_[s] << " " << lasertag.floor_.NumCells() << endl;
		lasertag.PrintState(*lasertag.states_[s], os);

		for (int d = 0; d < lasertag.NBEAMS; d++) {
			os << d;
			for (int i = 0; i < lasertag.reading_distributions_[s][d].size(); i++)
				os << " " << lasertag.reading_distributions_[s][d][i];
			os << endl;
		}
	}
	return os;
}